

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall Script_IsPushOnly_empty_Test::TestBody(Script_IsPushOnly_empty_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_80;
  Message local_78;
  bool local_6d [20];
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  Script script;
  Script_IsPushOnly_empty_Test *this_local;
  
  cfd::core::Script::Script((Script *)&gtest_ar.message_);
  local_59 = cfd::core::Script::IsPushOnly((Script *)&gtest_ar.message_);
  local_6d[0] = true;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_58,"script.IsPushOnly()","true",&local_59,local_6d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_script.cpp"
               ,0x159,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  cfd::core::Script::~Script((Script *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Script, IsPushOnly_empty) {
  Script script;
  EXPECT_EQ(script.IsPushOnly(), true);
}